

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu_intel.cc
# Opt level: O0

uint64_t OPENSSL_xgetbv(uint32_t xcr)

{
  undefined4 in_XCR0;
  undefined4 in_register_00000604;
  uint32_t edx;
  uint32_t eax;
  uint32_t xcr_local;
  
  return CONCAT44(in_register_00000604,in_XCR0);
}

Assistant:

static uint64_t OPENSSL_xgetbv(uint32_t xcr) {
#if defined(_MSC_VER)
  return (uint64_t)_xgetbv(xcr);
#else
  uint32_t eax, edx;
  __asm__ volatile("xgetbv" : "=a"(eax), "=d"(edx) : "c"(xcr));
  return (((uint64_t)edx) << 32) | eax;
#endif
}